

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

Type __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack<unsigned_long>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,unsigned_long value,
          CrtAllocator *allocator)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  undefined1 local_30 [8];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> v;
  CrtAllocator *allocator_local;
  unsigned_long value_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  v.data_.o.members = (Member *)allocator;
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_30,value);
  pGVar1 = PushBack(this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_30,
                    (CrtAllocator *)v.data_.o.members);
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_30);
  return pGVar1;
}

Assistant:

PushBack(T value, Allocator& allocator) {
        GenericValue v(value);
        return PushBack(v, allocator);
    }